

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emle.c
# Opt level: O1

void karma(int ip,int iq,double *phi,double *theta,double *A,double *P,double *V,int N,double *W,
          double *resid,double *sumlog,double *ssq,int iupd,double delta,int *iter,int *nit)

{
  double *pdVar1;
  double dVar2;
  int iVar3;
  void *__s;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  double *pdVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint uVar17;
  int iVar18;
  ulong uVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  long lVar8;
  
  *iter = 0;
  uVar11 = (ulong)(iq + 1U);
  if ((int)(iq + 1U) <= ip) {
    uVar11 = (ulong)(uint)ip;
  }
  iVar10 = (int)uVar11;
  __s = malloc((long)iVar10 << 3);
  if (0 < iVar10) {
    memset(__s,0,uVar11 << 3);
  }
  if (*nit == 0) {
    if (0 < N) {
      uVar13 = iVar10 - 1;
      pdVar1 = P + 1;
      lVar8 = (long)iq + 1;
      if ((long)iq + 1 <= (long)ip) {
        lVar8 = (long)ip;
      }
      uVar19 = 0;
      iVar18 = 0;
      do {
        dVar20 = W[uVar19];
        if (iupd != 1 || uVar19 != 0) {
          dVar21 = *A;
          if (1 < iVar10) {
            memmove(A,A + 1,(ulong)uVar13 << 3);
          }
          A[(int)uVar13] = 0.0;
          if (0 < ip) {
            uVar6 = 0;
            do {
              A[uVar6] = phi[uVar6] * dVar21 + A[uVar6];
              uVar6 = uVar6 + 1;
            } while ((uint)ip != uVar6);
          }
          if (0 < iVar10) {
            iVar3 = 0;
            iVar5 = -1;
            uVar6 = uVar11;
            uVar17 = uVar13;
            lVar7 = lVar8;
            do {
              lVar7 = lVar7 + -1;
              lVar15 = (long)iVar5;
              lVar16 = 0;
              do {
                dVar21 = V[lVar15 + lVar16 + 1];
                pdVar1[lVar15 + lVar16] = dVar21;
                if ((int)lVar7 != (int)lVar16) {
                  lVar12 = (long)(int)uVar17;
                  uVar17 = uVar17 + 1;
                  pdVar1[lVar15 + lVar16] = dVar21 + P[lVar12 + 1];
                }
                lVar16 = lVar16 + 1;
              } while ((iVar5 + (int)uVar6) - lVar15 != lVar16);
              iVar5 = iVar5 + (int)lVar16;
              iVar3 = iVar3 + 1;
              uVar6 = (ulong)((int)uVar6 - 1);
            } while (iVar3 != iVar10);
          }
        }
        dVar21 = ABS(*P);
        dVar22 = dVar20 - *A;
        if (1 < iVar10) {
          uVar4 = 1;
          pdVar9 = pdVar1;
          iVar3 = iVar10;
          uVar6 = uVar11;
          do {
            uVar6 = uVar6 - 1;
            dVar2 = P[uVar4];
            A[uVar4] = (dVar2 / dVar21) * dVar22 + A[uVar4];
            uVar14 = 0;
            do {
              P[(long)iVar3 + uVar14] = pdVar9[uVar14] * -(dVar2 / dVar21) + P[(long)iVar3 + uVar14]
              ;
              uVar14 = uVar14 + 1;
            } while (uVar6 != uVar14);
            iVar3 = iVar3 + (int)uVar14;
            uVar4 = uVar4 + 1;
            pdVar9 = pdVar9 + 1;
          } while (uVar4 != uVar11);
        }
        *A = dVar20;
        if (0 < iVar10) {
          memset(P,0,uVar11 * 8);
        }
        if (dVar21 < 0.0) {
          dVar20 = sqrt(dVar21);
        }
        else {
          dVar20 = SQRT(dVar21);
        }
        resid[uVar19] = dVar22 / dVar20;
        *(double *)((long)__s + (long)iVar18 * 8) = dVar22 / dVar20;
        iVar18 = iVar18 + 1;
        if (iq <= iVar18) {
          iVar18 = 0;
        }
        *ssq = (dVar22 * dVar22) / dVar21 + *ssq;
        dVar20 = log(dVar21);
        *sumlog = dVar20 + *sumlog;
        *iter = *iter + 1;
        uVar19 = uVar19 + 1;
      } while (uVar19 != (uint)N);
    }
    *nit = N;
  }
  else {
    *nit = 0;
    if (0 < N) {
      iVar10 = *iter;
      uVar13 = 0xffffffff;
      uVar11 = 0;
      iVar18 = 0;
      do {
        dVar20 = W[uVar11];
        if (0 < ip) {
          uVar19 = 0;
          uVar17 = uVar13;
          do {
            if (0 < (int)(uVar17 + 1)) {
              dVar20 = dVar20 - phi[uVar19] * W[uVar17];
            }
            uVar19 = uVar19 + 1;
            uVar17 = uVar17 - 1;
          } while ((uint)ip != uVar19);
        }
        if (0 < iq) {
          do {
            iVar3 = iVar18;
            if (iVar18 == 0) {
              iVar3 = iq;
            }
            iVar18 = iVar3 + -1;
            dVar20 = dVar20 + *(double *)((long)__s + (long)iVar3 * 8 + -8) * -*theta;
          } while (0 < iq);
        }
        *(double *)((long)__s + (long)iVar18 * 8) = dVar20;
        resid[uVar11] = dVar20;
        iVar18 = iVar18 + 1;
        if (iq <= iVar18) {
          iVar18 = 0;
        }
        *ssq = dVar20 * dVar20 + *ssq;
        uVar11 = uVar11 + 1;
        uVar13 = uVar13 + 1;
      } while (uVar11 != (uint)N);
      *iter = iVar10 + N;
    }
  }
  if (*iter == 0) {
    *iter = 1;
  }
  free(__s);
  return;
}

Assistant:

void karma(int ip,int iq,double *phi,double *theta,double *A,double *P,double*V,int N,
	double *W,double *resid,double *sumlog,double *ssq,int iupd,double delta,int *iter,int *nit) {
	int ir,np,i,j,ir1,inde,swtch,ind,indn,l,ii,indw;
	double wnext,dt,A1,ft,ut,g,et;
	double *E;

	ir = iq + 1;
	swtch = 0;
	*iter = 0;

	if (ir < ip) {
		ir = ip;
	}
	E = (double*)malloc(sizeof(double)* ir);
	np = (ir * (ir + 1)) / 2;

	ir1 = ir - 1;
	for (i = 0; i < ir; ++i) {
		E[i] = 0.0;
	}
	inde = 0;

	if (*nit == 0) {
		for (i = 0; i < N; ++i) {//500
			wnext = W[i];
			if (iupd != 1 || i > 0) {//300
				dt = 0.0;
				if (ir != 1) {
					dt = P[ir];
				}
				/*
				if (dt < delta) {
					swtch = 1;
					*nit = i + 1;
					break;//610
				}
				*/
				A1 = A[0];
				if (ir != 1) {//110
					for (j = 0; j < ir1; ++j) {
						A[j] = A[j + 1];
					}
				}//110
				A[ir - 1] = 0.0;
				if (ip != 0) {//200
					for (j = 0; j < ip; ++j) {
						A[j] += phi[j] * A1;
					}
				}//200
				ind = -1;
				indn = ir-1;
				for (l = 0; l < ir; ++l) {
					for (j = l; j < ir; ++j) {
						ind++;
						P[ind] = V[ind];
						if (j != (ir - 1)) {
							indn++;
							P[ind] += P[indn];
						}
					}
				}
			}//300
			ft = fabs(P[0]);//modification
			ut = wnext - A[0];
			if (ir != 1) {//410
				ind = ir;
				for (j = 1; j < ir; ++j) {
					g = P[j] / ft;
					A[j] += g*ut;
					for (l = j; l < ir; ++l) {
						P[ind] -= g*P[l];
						ind++;
					}
				}
			}//410
			A[0] = wnext;
			for (l = 0; l < ir; ++l) {
				P[l] = 0.0;
			}
			resid[i] = ut / sqrt(ft);
			E[inde] = resid[i];
			inde++;
			if (inde >= iq) {
				inde = 0;
			}
			*ssq += (ut*ut) / ft;
			*sumlog += log(ft);// alog
			*iter = *iter + 1;;
			//printf(" sl %g", *sumlog);


		}//500
		if (swtch == 0) {
			*nit = N;
		}
	}
	else {
		i = 0;
		*nit = i;
		for (ii = i; ii < N; ++ii) {//650
			et = W[ii];
			indw = ii;
			if (ip != 0) {//630
				for (j = 0; j < ip; ++j) {
					indw--;
					if (indw >= 0) {
						et -= phi[j] * W[indw];
					}
				}
			}//630
			if (iq != 0) {//645
				for (j = 0; j < iq; ++i) {
					inde--;
					if (inde == -1) {
						inde = iq-1;
					}
					et -= theta[j] * E[inde];
				}
			}//645
			E[inde] = et;
			resid[ii] = et;
			*ssq += et*et;
			*iter = *iter + 1;
			inde++;
			if (inde >= iq) {
				inde = 0;
			}
		}//650

	}
	if (*iter == 0) {
		*iter = 1;
	}
	free(E);
}